

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O2

void __thiscall tcmalloc::ThreadCache::Init(ThreadCache *this)

{
  ThreadCacheFreeList *this_00;
  int cl;
  long lVar1;
  size_t *psVar2;
  
  this->size_ = 0;
  this->max_size_ = 0;
  this->prev = (ThreadCache *)0x0;
  this->next = (ThreadCache *)0x0;
  this->total_alloc_ = 0;
  this->total_free_ = 0;
  IncreaseCacheLimitLocked(this);
  this_00 = this->freelists_;
  psVar2 = &SizeClasses;
  for (lVar1 = 0; lVar1 != 0x56; lVar1 = lVar1 + 1) {
    ThreadCacheFreeList::Init(this_00,(int)lVar1,*psVar2);
    psVar2 = psVar2 + 3;
    this_00 = this_00 + 1;
  }
  return;
}

Assistant:

void Init() {
        total_alloc_ = 0;
        total_free_ = 0;
        prev = nullptr;
        next = nullptr;

        size_ = 0;
        max_size_ = 0;
        IncreaseCacheLimitLocked();
        if (max_size_ < 0) {
            max_size_ = kMinThreadCacheSize;
            unclaimed_cache_space -= kMinThreadCacheSize;
        }
        for (int cl = 0; cl < kMaxClass; ++cl) {
            freelists_[cl].Init(cl, ClassSize(cl));
        }
    }